

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
DoSetProperty<Js::OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)0>>const__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *playout,Var instance,
          PropertyOperationFlags flags)

{
  PropertyId pid;
  Var playout_00;
  bool bVar1;
  RecyclableObject *instance_00;
  ScriptFunction *this_00;
  ConstructorCache *this_01;
  ScriptContext *this_02;
  ThreadContext *threadContext;
  InlineCache *local_30;
  InlineCache *inlineCache;
  PropertyId propertyId;
  PropertyOperationFlags flags_local;
  Var instance_local;
  OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *playout_local;
  InterpreterStackFrame *this_local;
  
  inlineCache._4_4_ = flags;
  _propertyId = instance;
  instance_local = playout;
  playout_local = (OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *)this;
  inlineCache._0_4_ = GetPropertyIdFromCacheId(this,(uint)playout->inlineCacheIndex);
  bVar1 = TaggedNumber::Is(_propertyId);
  playout_00 = instance_local;
  pid = (PropertyId)inlineCache;
  if (!bVar1) {
    instance_00 = UnsafeVarTo<Js::RecyclableObject>(_propertyId);
    bVar1 = TrySetPropertyLocalFastPath<Js::OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)0>>const__unaligned>
                      (this,(OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *)
                            playout_00,pid,instance_00,&local_30,inlineCache._4_4_);
    if (bVar1) {
      this_00 = GetJavascriptFunction(this);
      this_01 = JavascriptFunction::GetConstructorCache((JavascriptFunction *)this_00);
      bVar1 = ConstructorCache::NeedsUpdateAfterCtor(this_01);
      if (!bVar1) {
        return;
      }
      this_02 = GetScriptContext(this);
      threadContext = ScriptContext::GetThreadContext(this_02);
      InlineCache::RemoveFromInvalidationListAndClear(local_30,threadContext);
      return;
    }
  }
  DoSetProperty_NoFastPath<Js::OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)0>>const__unaligned>
            (this,(OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *)instance_local,
             _propertyId,inlineCache._4_4_);
  return;
}

Assistant:

inline void InterpreterStackFrame::DoSetProperty(unaligned T* playout, Var instance, PropertyOperationFlags flags)
    {
        // Same fast path as in the backend.

        PropertyId propertyId = GetPropertyIdFromCacheId(playout->inlineCacheIndex);
        InlineCache *inlineCache;

        if (!TaggedNumber::Is(instance)
            && TrySetPropertyLocalFastPath(playout, propertyId, UnsafeVarTo<RecyclableObject>(instance), inlineCache, flags))
        {
            if (GetJavascriptFunction()->GetConstructorCache()->NeedsUpdateAfterCtor())
            {
                // This function has only 'this' statements and is being used as a constructor. When the constructor exits, the
                // function object's constructor cache will be updated with the type produced by the constructor. From that
                // point on, when the same function object is used as a constructor, the a new object with the final type will
                // be created. Whatever is stored in the inline cache currently will cause cache misses after the constructor
                // cache update. So, just clear it now so that the caches won't be flagged as polymorphic.
                inlineCache->RemoveFromInvalidationListAndClear(this->GetScriptContext()->GetThreadContext());
            }
            return;
        }

        DoSetProperty_NoFastPath(playout, instance, flags);
    }